

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *__s1;
  int iVar3;
  char *in_RAX;
  size_t sVar4;
  Header *pHVar5;
  int *piVar6;
  void *pvVar7;
  undefined4 *puVar8;
  char *pcVar9;
  ulong uVar10;
  AcesInputFile in;
  Header h;
  allocator<char> local_c9;
  char *local_c8;
  Rgba local_c0 [2];
  char *local_b0;
  RgbaChannels local_a4;
  long *local_a0 [2];
  long local_90 [2];
  long local_80;
  char **local_78;
  long local_70;
  Header local_68 [56];
  
  if (1 < argc) {
    uVar10 = 1;
    pcVar9 = (char *)0x0;
    local_b0 = (char *)0x0;
    local_c8 = (char *)0x0;
    local_78 = argv;
    do {
      __s1 = local_78[uVar10];
      if (*__s1 == '-') {
        if ((__s1[1] != 'v') || (__s1[2] != '\0')) {
          if ((__s1[1] == 'h') && (__s1[2] == '\0')) goto LAB_0010248e;
          goto LAB_0010243f;
        }
        local_b0 = (char *)CONCAT71((int7)((ulong)in_RAX >> 8),1);
        in_RAX = local_b0;
        __s1 = local_c8;
      }
      else {
LAB_0010243f:
        iVar3 = strcmp(__s1,"--help");
        if (iVar3 == 0) {
LAB_0010248e:
          anon_unknown.dwarf_3b75::usageMessage((ostream *)&std::cout,"exr2aces",true);
          return 0;
        }
        iVar3 = strcmp(__s1,"--version");
        if (iVar3 == 0) {
          pcVar9 = (char *)Imf_3_4::getLibraryVersion();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"exr2aces (OpenEXR) ",0x13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3.4.0",5);
          iVar3 = strcmp(pcVar9,"3.4.0");
          if (iVar3 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"(OpenEXR version ",0x11);
            if (pcVar9 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1060d8);
            }
            else {
              sVar4 = strlen(pcVar9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar4)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," https://openexr.com",0x14);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Copyright (c) Contributors to the OpenEXR Project",0x31)
          ;
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"License BSD-3-Clause",0x14);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
          return 0;
        }
        in_RAX = __s1;
        if (pcVar9 == (char *)0x0) {
          in_RAX = local_c8;
          pcVar9 = __s1;
          __s1 = local_c8;
        }
      }
      local_c8 = __s1;
      uVar10 = uVar10 + 1;
    } while ((uint)argc != uVar10);
    argv = local_78;
    if (local_c8 != (char *)0x0 && pcVar9 != (char *)0x0) {
      local_a0[0] = (long *)0x0;
      Imf_3_4::Header::Header((Header *)0x3f800000,0x3f800000,local_68,0x40,0x40,local_a0,0,3);
      if (((ulong)local_b0 & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Reading file ",0xd);
        sVar4 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar4);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,pcVar9,&local_c9);
      iVar3 = Imf_3_4::globalThreadCount();
      Imf_3_4::AcesInputFile::AcesInputFile((AcesInputFile *)local_c0,(string *)local_a0,iVar3);
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0],local_90[0] + 1);
      }
      pHVar5 = (Header *)Imf_3_4::AcesInputFile::header();
      Imf_3_4::Header::operator=(local_68,pHVar5);
      local_a4 = Imf_3_4::AcesInputFile::channels();
      piVar6 = (int *)Imf_3_4::Header::dataWindow();
      iVar3 = *piVar6;
      iVar1 = piVar6[1];
      uVar2 = piVar6[2];
      local_70 = ((long)piVar6[3] - (long)iVar1) + 1;
      local_80 = (long)(int)((uVar2 - iVar3) + 1);
      pvVar7 = operator_new__(-(ulong)((ulong)(local_70 * local_80) >> 0x3d != 0) |
                              local_70 * local_80 * 8);
      uVar10 = (long)pvVar7 + ((long)(int)~uVar2 + (long)iVar3) * (long)iVar1 * 8 + (long)iVar3 * -8
      ;
      Imf_3_4::AcesInputFile::setFrameBuffer(local_c0,uVar10,1);
      Imf_3_4::AcesInputFile::readPixels((int)local_c0,iVar1);
      Imf_3_4::AcesInputFile::~AcesInputFile((AcesInputFile *)local_c0);
      piVar6 = (int *)Imf_3_4::Header::compression();
      if (*piVar6 - 6U < 2) {
        puVar8 = (undefined4 *)Imf_3_4::Header::compression();
        *puVar8 = 7;
      }
      else if (*piVar6 != 0) {
        puVar8 = (undefined4 *)Imf_3_4::Header::compression();
        *puVar8 = 4;
      }
      if (((ulong)local_b0 & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Writing file ",0xd);
        pcVar9 = local_c8;
        sVar4 = strlen(local_c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar4);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,local_c8,&local_c9);
      iVar3 = Imf_3_4::globalThreadCount();
      Imf_3_4::AcesOutputFile::AcesOutputFile
                ((AcesOutputFile *)local_c0,(string *)local_a0,local_68,local_a4,iVar3);
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0],local_90[0] + 1);
      }
      Imf_3_4::AcesOutputFile::setFrameBuffer(local_c0,uVar10,1);
      Imf_3_4::AcesOutputFile::writePixels((int)local_c0);
      Imf_3_4::AcesOutputFile::~AcesOutputFile((AcesOutputFile *)local_c0);
      Imf_3_4::Header::~Header(local_68);
      operator_delete__(pvVar7);
      return 0;
    }
  }
  anon_unknown.dwarf_3b75::usageMessage((ostream *)&std::cerr,*argv,false);
  return -1;
}

Assistant:

int
main (int argc, char** argv)
{
    const char* inFile  = 0;
    const char* outFile = 0;
    bool        verbose = false;

    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    int i = 1;

    while (i < argc)
    {
        if (!strcmp (argv[i], "-v"))
        {
            //
            // Verbose mode
            //

            verbose = true;
            i += 1;
        }
        else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
        {
            //
            // Print help message
            //

            usageMessage (cout, "exr2aces", true);
            return 0;
        }
        else if (!strcmp (argv[i], "--version"))
        {
            const char* libraryVersion = getLibraryVersion ();

            cout << "exr2aces (OpenEXR) " << OPENEXR_VERSION_STRING;
            if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                cout << "(OpenEXR version " << libraryVersion << ")";
            cout << " https://openexr.com" << endl;
            cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
            cout << "License BSD-3-Clause" << endl;

            return 0;
        }
        else
        {
            //
            // Image file name
            //

            if (inFile == 0)
                inFile = argv[i];
            else
                outFile = argv[i];

            i += 1;
        }
    }

    if (inFile == 0 || outFile == 0)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    //
    // Load inFile, and save a tiled version in outFile.
    //

    try
    {
        exr2aces (inFile, outFile, verbose);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ":  " << e.what () << endl;
        return 1;
    }

    return 0;
}